

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::enqueue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *item)

{
  mutex_type *in_RDI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> *this_00;
  async_msg *in_stack_ffffffffffffffc8;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffd0;
  unique_lock<std::mutex> local_20 [2];
  
  this_00 = local_20;
  std::unique_lock<std::mutex>::unique_lock(this_00,in_RDI);
  std::condition_variable::
  wait<spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::enqueue(spdlog::details::async_msg&&)::_lambda()_1_>
            ((condition_variable *)in_stack_ffffffffffffffc8,this_00,in_stack_ffffffffffffffd0);
  circular_q<spdlog::details::async_msg>::push_back
            ((circular_q<spdlog::details::async_msg> *)in_stack_ffffffffffffffd0.this,
             in_stack_ffffffffffffffc8);
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void enqueue(T &&item) {
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            pop_cv_.wait(lock, [this] { return !this->q_.full(); });
            q_.push_back(std::move(item));
        }
        push_cv_.notify_one();
    }